

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdGraph.cpp
# Opt level: O2

bool __thiscall HACD::Graph::DeleteVertex(Graph *this,long name)

{
  SArray<long,_16UL> *this_00;
  long lVar1;
  pointer pGVar2;
  _Vector_base<long,_std::allocator<long>_> local_48;
  
  pGVar2 = (this->m_vertices).
           super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar1 = ((long)(this->m_vertices).
                 super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pGVar2) / 0x310;
  if (name < lVar1) {
    this_00 = &pGVar2[name].m_edges;
    *(bool *)(this_00 + 1) = true;
    SArray<long,_16UL>::Clear(this_00);
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<long,_std::allocator<long>_>::_M_move_assign
              (&(this->m_vertices).
                super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
                super__Vector_impl_data._M_start[name].m_ancestors,&local_48);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_48);
    pGVar2 = (this->m_vertices).
             super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pGVar2[name].m_convexHull != (ICHUll *)0x0) {
      (*(pGVar2[name].m_convexHull)->_vptr_ICHUll[1])();
      pGVar2 = (this->m_vertices).
               super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    SArray<HACD::DPoint,_16UL>::Clear(&pGVar2[name].m_distPoints);
    SArray<unsigned_long_long,_16UL>::Clear
              (&(this->m_vertices).
                super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
                super__Vector_impl_data._M_start[name].m_boudaryEdges);
    (this->m_vertices).super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>.
    _M_impl.super__Vector_impl_data._M_start[name].m_convexHull = (ICHUll *)0x0;
    this->m_nV = this->m_nV - 1;
  }
  return name < lVar1;
}

Assistant:

bool Graph::DeleteVertex(long name)
    {
		if (name < static_cast<long>(m_vertices.size()))
		{
			m_vertices[name].m_deleted = true;
            m_vertices[name].m_edges.Clear();
            m_vertices[name].m_ancestors = std::vector<long>();
            delete m_vertices[name].m_convexHull;
			m_vertices[name].m_distPoints.Clear();
			m_vertices[name].m_boudaryEdges.Clear();
            m_vertices[name].m_convexHull = 0;
			m_nV--;
			return true;
		}
		return false;
    }